

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timebase_helper.c
# Opt level: O1

void helper_store_dcr_ppc64(CPUPPCState_conflict2 *env,target_ulong dcrn,target_ulong val)

{
  TCGContext_conflict10 *s;
  int iVar1;
  TCGTemp *pTVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  TCGv_i32 *ppTVar6;
  ulong uVar7;
  char *pcVar8;
  size_t sVar9;
  
  if (env->dcr_env == (ppc_dcr_t *)0x0) {
    helper_store_dcr_ppc64_cold_2();
  }
  else {
    iVar1 = ppc_dcr_write_ppc64(env->dcr_env,(int)dcrn,(uint32_t)val);
    if (iVar1 == 0) {
      return;
    }
  }
  helper_store_dcr_ppc64_cold_1();
  s = (TCGContext_conflict10 *)env->slb[1].sps;
  pcVar8 = cpu_reg_names;
  sVar9 = 0x134;
  ppTVar6 = cpu_crf;
  lVar5 = 0x210;
  uVar4 = 0;
  do {
    snprintf(pcVar8,sVar9,"crf%d",uVar4 & 0xffffffff);
    pTVar2 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I32,s->cpu_env,lVar5,pcVar8);
    *ppTVar6 = (TCGv_i32)((long)pTVar2 - (long)s);
    pcVar8 = pcVar8 + 5;
    sVar9 = sVar9 - 5;
    uVar4 = uVar4 + 1;
    ppTVar6 = ppTVar6 + 1;
    lVar5 = lVar5 + 4;
  } while (uVar4 != 8);
  sVar9 = 0x10c;
  lVar5 = 0;
  uVar4 = 0;
  do {
    snprintf(pcVar8,sVar9,"r%d",uVar4 & 0xffffffff);
    pTVar2 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,lVar5,pcVar8);
    *(long *)((long)cpu_gpr + lVar5) = (long)pTVar2 - (long)s;
    lVar3 = 4 - (ulong)(uVar4 < 10);
    pcVar8 = pcVar8 + lVar3;
    sVar9 = sVar9 - lVar3;
    snprintf(pcVar8,sVar9,"r%dH",uVar4 & 0xffffffff);
    pTVar2 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,lVar5 + 0x100,pcVar8);
    *(long *)((long)cpu_gprh + lVar5) = (long)pTVar2 - (long)s;
    uVar7 = (ulong)(uVar4 < 10) ^ 5;
    pcVar8 = pcVar8 + uVar7;
    sVar9 = sVar9 - uVar7;
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 8;
  } while (uVar4 != 0x20);
  pTVar2 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x2a8,"nip");
  cpu_nip = (TCGv_i64)((long)pTVar2 - (long)s);
  pTVar2 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x280,"msr");
  cpu_msr = (TCGv_i64)((long)pTVar2 - (long)s);
  pTVar2 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x208,"ctr");
  cpu_ctr = (TCGv_i64)((long)pTVar2 - (long)s);
  pTVar2 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x200,"lr");
  cpu_lr = (TCGv_i64)((long)pTVar2 - (long)s);
  pTVar2 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x230,"cfar");
  cpu_cfar = (TCGv_i64)((long)pTVar2 - (long)s);
  pTVar2 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x238,"xer");
  cpu_xer = (TCGv_i64)((long)pTVar2 - (long)s);
  pTVar2 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x240,"SO");
  cpu_so = (TCGv_i64)((long)pTVar2 - (long)s);
  pTVar2 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x248,"OV");
  cpu_ov = (TCGv_i64)((long)pTVar2 - (long)s);
  pTVar2 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x250,"CA");
  cpu_ca = (TCGv_i64)((long)pTVar2 - (long)s);
  pTVar2 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,600,"OV32");
  cpu_ov32 = (TCGv_i64)((long)pTVar2 - (long)s);
  pTVar2 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x260,"CA32");
  cpu_ca32 = (TCGv_i64)((long)pTVar2 - (long)s);
  pTVar2 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x268,"reserve_addr");
  cpu_reserve = (TCGv_i64)((long)pTVar2 - (long)s);
  pTVar2 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x270,"reserve_val");
  cpu_reserve_val = (TCGv_i64)((long)pTVar2 - (long)s);
  pTVar2 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x12f50,"fpscr");
  cpu_fpscr = (TCGv_i64)((long)pTVar2 - (long)s);
  pTVar2 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I32,s->cpu_env,0x2b8,"access_type");
  cpu_access_type = (TCGv_i32)((long)pTVar2 - (long)s);
  return;
}

Assistant:

void helper_store_dcr(CPUPPCState *env, target_ulong dcrn, target_ulong val)
{
    if (unlikely(env->dcr_env == NULL)) {
#if 0
        qemu_log_mask(LOG_GUEST_ERROR, "No DCR environment\n");
#endif
        raise_exception_err_ra(env, POWERPC_EXCP_PROGRAM,
                               POWERPC_EXCP_INVAL |
                               POWERPC_EXCP_INVAL_INVAL, GETPC());
    } else {
        int ret;
        ret = ppc_dcr_write(env->dcr_env, (uint32_t)dcrn, (uint32_t)val);
        if (unlikely(ret != 0)) {
#if 0
            qemu_log_mask(LOG_GUEST_ERROR, "DCR write error %d %03x\n",
                          (uint32_t)dcrn, (uint32_t)dcrn);
#endif
            raise_exception_err_ra(env, POWERPC_EXCP_PROGRAM,
                                   POWERPC_EXCP_INVAL |
                                   POWERPC_EXCP_PRIV_REG, GETPC());
        }
    }
}